

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

QString * formatLogMessage(QString *__return_storage_ptr__,QtMsgType type,
                          QMessageLogContext *context,QString *str)

{
  BacktraceParams *pBVar1;
  QString *pQVar2;
  undefined1 auVar3 [16];
  QByteArray info;
  long lVar4;
  QBasicMutex QVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  Type *pTVar9;
  long lVar10;
  qint64 n;
  pthread_t __target_thread;
  QThread *n_00;
  undefined8 extraout_RAX;
  char **ppcVar11;
  char *pcVar12;
  long lVar13;
  qsizetype objectSize;
  QBasicMutex *this;
  QArrayData *data;
  int iVar14;
  long lVar15;
  long in_FS_OFFSET;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QUtf8StringView str_03;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  undefined1 in_stack_ffffffffffffff08 [15];
  int iVar21;
  QDateTime local_b0;
  QByteArray local_a8;
  QString local_90;
  BacktraceParams local_78;
  QString local_58;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((AtomicType)QMessagePattern::mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
    this = (QBasicMutex *)__return_storage_ptr__;
  }
  else {
    this = &QMessagePattern::mutex;
    QBasicMutex::lockInternal(&QMessagePattern::mutex);
  }
  pTVar9 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                       *)this);
  if (pTVar9 == (Type *)0x0) {
    QString::append(__return_storage_ptr__,str);
LAB_00212d09:
    QVar5.d_ptr._q_value._M_b._M_p = QMessagePattern::mutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar5.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex
                (&QMessagePattern::mutex,(void *)QVar5.d_ptr._q_value._M_b._M_p);
    }
    if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
      return *(QString **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    ppcVar11 = (pTVar9->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar11 != (char **)0x0) {
      bVar16 = type != QtFatalMsg;
      bVar17 = type != QtCriticalMsg;
      bVar18 = type != QtWarningMsg;
      bVar19 = type != QtInfoMsg;
      bVar20 = type != QtDebugMsg;
      lVar15 = 0;
      bVar6 = 0;
      iVar21 = 0;
      iVar14 = 0;
      do {
        pcVar12 = ppcVar11[lVar15];
        if (pcVar12 == (char *)0x0) goto LAB_00212d09;
        if (pcVar12 == "%{endif}") goto LAB_0021275c;
        if ((bVar6 & 1) == 0) {
          if (pcVar12 == "%{message}") {
            QString::append(__return_storage_ptr__,str);
          }
          else if (pcVar12 == "%{category}") {
            pcVar12 = context->category;
            if (pcVar12 == (char *)0x0) {
              lVar13 = 0;
            }
            else {
              lVar10 = -1;
              do {
                lVar13 = lVar10 + 1;
                lVar4 = lVar10 + 1;
                lVar10 = lVar13;
              } while (pcVar12[lVar4] != '\0');
            }
            str_00.m_data = pcVar12;
            str_00.m_size = lVar13;
            QString::append(__return_storage_ptr__,str_00);
          }
          else if (pcVar12 == "%{type}") {
            if (type < (QtInfoMsg|QtWarningMsg)) {
              lVar13 = *(long *)(&DAT_004c77f8 + (ulong)type * 8);
              pcVar12 = &DAT_004c7820 + *(int *)(&DAT_004c7820 + (ulong)type * 4);
              goto LAB_00212754;
            }
          }
          else if (pcVar12 == "%{file}") {
            pcVar12 = context->file;
            if (pcVar12 == (char *)0x0) {
LAB_00212748:
              lVar13 = 7;
              pcVar12 = "unknown";
            }
            else {
              lVar13 = -1;
              do {
                lVar10 = lVar13 + 1;
                lVar13 = lVar13 + 1;
              } while (pcVar12[lVar10] != '\0');
            }
LAB_00212754:
            str_01.m_data = pcVar12;
            str_01.m_size = lVar13;
            QString::append(__return_storage_ptr__,str_01);
          }
          else {
            if (pcVar12 == "%{line}") {
              QString::number(&local_58,context->line,10);
              QString::append(__return_storage_ptr__,&local_58);
              goto LAB_00212891;
            }
            if (pcVar12 == "%{function}") {
              if (context->function == (char *)0x0) goto LAB_00212748;
              QByteArray::QByteArray(&local_a8,context->function,-1);
              info.d.ptr._7_1_ = bVar16;
              info.d._0_15_ = in_stack_ffffffffffffff08;
              info.d.size._0_1_ = bVar17;
              info.d.size._1_1_ = bVar18;
              info.d.size._2_1_ = bVar19;
              info.d.size._3_1_ = bVar20;
              info.d.size._4_4_ = iVar21;
              qCleanupFuncinfo((QByteArray *)&local_90,info);
              ba.m_data = (storage_type *)ppcVar11;
              ba.m_size = (qsizetype)local_90.d.ptr;
              QString::fromLatin1(&local_58,(QString *)local_90.d.size,ba);
              QString::append(__return_storage_ptr__,&local_58);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0021275c;
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i !=
                  0) goto LAB_0021275c;
              objectSize = 1;
              data = &(local_a8.d.d)->super_QArrayData;
            }
            else {
              if (pcVar12 == "%{pid}") {
                n = QCoreApplication::applicationPid();
                QString::number(&local_58,n,10);
                QString::append(__return_storage_ptr__,&local_58);
LAB_00212891:
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  data = &(local_58.d.d)->super_QArrayData;
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) goto LAB_002128b3;
                }
                goto LAB_0021275c;
              }
              if (pcVar12 == "%{appname}") {
                QCoreApplication::applicationName();
                QString::append(__return_storage_ptr__,&local_58);
                goto LAB_00212891;
              }
              if (pcVar12 == "%{threadid}") {
                lVar13 = syscall(0xba);
                QString::number(&local_58,lVar13,10);
                QString::append(__return_storage_ptr__,&local_58);
                goto LAB_00212891;
              }
              if (pcVar12 == "%{threadname}") {
                local_58.d.d = (Data *)0x0;
                local_58.d.ptr = (char16_t *)0x0;
                __target_thread = pthread_self();
                iVar8 = pthread_getname_np(__target_thread,(char *)&local_58,0x10);
                if (iVar8 == 0) {
                  lVar13 = -1;
                  do {
                    lVar10 = lVar13 + 1;
                    lVar13 = lVar13 + 1;
                  } while (*(char *)((long)&local_58.d.d + lVar10) != '\0');
                  if (lVar13 != 0) {
                    str_03.m_size = lVar13;
                    str_03.m_data = (storage_type *)&local_58;
                    QString::append(__return_storage_ptr__,str_03);
                    goto LAB_0021275c;
                  }
                }
                lVar13 = syscall(0xba);
                QString::number(&local_58,lVar13,10);
                QString::append(__return_storage_ptr__,&local_58);
                goto LAB_00212891;
              }
              if (pcVar12 == "%{qthreadptr}") {
                str_02.m_data = "0x";
                str_02.m_size = 2;
                QString::append(__return_storage_ptr__,str_02);
                QThread::currentThread();
                n_00 = QThread::currentThread();
                QString::number(&local_58,(qlonglong)n_00,0x10);
                QString::append(__return_storage_ptr__,&local_58);
                goto LAB_00212891;
              }
              if (pcVar12 != "%{backtrace") {
                if (pcVar12 == "%{time") {
                  pQVar2 = (pTVar9->timeArgs).d.ptr;
                  local_58.d.d = pQVar2[iVar21].d.d;
                  local_58.d.ptr = pQVar2[iVar21].d.ptr;
                  local_58.d.size = pQVar2[iVar21].d.size;
                  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                    super___atomic_base<int>._M_i =
                         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                         super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  if (local_58.d.size == 0) {
                    QDateTime::currentDateTime();
                    QDateTime::toString(&local_90,&local_b0,ISODate);
                    QString::append(__return_storage_ptr__,&local_90);
LAB_00212c82:
                    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_90.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QDateTime::~QDateTime(&local_b0);
                  }
                  else {
                    if (local_58.d.size == 4) {
                      rhs_00.m_data = "boot";
                      rhs_00.m_size = 4;
                      lhs_00.m_data = local_58.d.ptr;
                      lhs_00.m_size = 4;
                      bVar7 = QtPrivate::equalStrings(lhs_00,rhs_00);
                      if (!bVar7) {
LAB_00212c25:
                        QDateTime::currentDateTime();
                        QDateTime::toString(&local_90,&local_b0,&local_58);
                        QString::append(__return_storage_ptr__,&local_90);
                        goto LAB_00212c82;
                      }
                      lVar13 = std::chrono::_V2::steady_clock::now();
                      QString::asprintf((char **)&local_90,"%6lld.%03u",lVar13 / 1000000000,
                                        (ulong)(uint)((int)(lVar13 / 1000000000) * -1000 +
                                                     ((int)(SUB168(SEXT816(lVar13) *
                                                                   SEXT816(0x431bde82d7b634db),8) >>
                                                           0x12) -
                                                     (SUB164(SEXT816(lVar13) *
                                                             SEXT816(0x431bde82d7b634db),0xc) >>
                                                     0x1f))));
                      QString::append(__return_storage_ptr__,&local_90);
                    }
                    else {
                      if ((local_58.d.size != 7) ||
                         (rhs.m_data = "process", rhs.m_size = 7, lhs.m_data = local_58.d.ptr,
                         lhs.m_size = 7, bVar7 = QtPrivate::equalStrings(lhs,rhs), !bVar7))
                      goto LAB_00212c25;
                      lVar13 = std::chrono::_V2::steady_clock::now();
                      lVar13 = lVar13 - (pTVar9->appStartTime).__d.__r;
                      auVar3 = SEXT816(lVar13) * SEXT816(0x431bde82d7b634db);
                      lVar13 = lVar13 / 1000000000;
                      QString::asprintf((char **)&local_90,"%6lld.%03u",lVar13,
                                        (ulong)(uint)((int)lVar13 * -1000 +
                                                     ((int)(auVar3._8_8_ >> 0x12) -
                                                     (auVar3._12_4_ >> 0x1f))));
                      QString::append(__return_storage_ptr__,&local_90);
                    }
                    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_90.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  iVar21 = iVar21 + 1;
                }
                else {
                  if (pcVar12 != "%{if-category}") {
                    bVar6 = bVar20;
                    if ((((pcVar12 == "%{if-debug}") || (bVar6 = bVar19, pcVar12 == "%{if-info}"))
                        || (bVar6 = bVar18, pcVar12 == "%{if-warning}")) ||
                       ((bVar6 = bVar17, pcVar12 == "%{if-critical}" ||
                        (bVar6 = bVar16, pcVar12 == "%{if-fatal}")))) goto LAB_0021275e;
                    lVar13 = -1;
                    do {
                      lVar10 = lVar13 + 1;
                      lVar13 = lVar13 + 1;
                    } while (pcVar12[lVar10] != '\0');
                    goto LAB_00212754;
                  }
                  if ((context->category == (char *)0x0) ||
                     (iVar8 = strcmp(context->category,"default"), iVar8 == 0)) goto LAB_002125b0;
                }
                goto LAB_0021275c;
              }
              pBVar1 = (pTVar9->backtraceArgs).d.ptr;
              data = &(pBVar1[iVar14].backtraceSeparator.d.d)->super_QArrayData;
              local_78.backtraceSeparator.d.ptr = pBVar1[iVar14].backtraceSeparator.d.ptr;
              local_78.backtraceSeparator.d.size = pBVar1[iVar14].backtraceSeparator.d.size;
              if (data == (QArrayData *)0x0) {
                local_78.backtraceDepth = pBVar1[iVar14].backtraceDepth;
                local_78.backtraceSeparator.d.d = (Data *)0x0;
              }
              else {
                LOCK();
                (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                     (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                local_78.backtraceDepth = pBVar1[iVar14].backtraceDepth;
                LOCK();
                (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                     (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                local_78.backtraceSeparator.d.d = (Data *)data;
              }
              formatBacktraceForLogMessage(&local_58,&local_78,context);
              QString::append(__return_storage_ptr__,&local_58);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_78.backtraceSeparator.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_78.backtraceSeparator.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar14 = iVar14 + 1;
              if (data == (QArrayData *)0x0) goto LAB_0021275c;
              LOCK();
              (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i != 0)
              goto LAB_0021275c;
LAB_002128b3:
              objectSize = 2;
            }
            QArrayData::deallocate(data,objectSize,0x10);
          }
LAB_0021275c:
          bVar6 = 0;
        }
        else {
          if (pcVar12 == "%{time") {
            iVar21 = iVar21 + 1;
          }
          else {
            iVar14 = iVar14 + (uint)(pcVar12 == "%{backtrace");
          }
LAB_002125b0:
          bVar6 = 1;
        }
LAB_0021275e:
        lVar15 = lVar15 + 1;
        ppcVar11 = (pTVar9->tokens)._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
      } while (ppcVar11 != (char **)0x0);
    }
    if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
      formatLogMessage();
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar5.d_ptr._q_value._M_b._M_p = QMessagePattern::mutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
      UNLOCK();
      if ((AtomicType)QVar5.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
        QBasicMutex::unlockInternalFutex
                  (&QMessagePattern::mutex,(void *)QVar5.d_ptr._q_value._M_b._M_p);
      }
      QString::~QString(__return_storage_ptr__);
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(extraout_RAX);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString formatLogMessage(QtMsgType type, const QMessageLogContext &context, const QString &str)
{
    QString message;

    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    QMessagePattern *pattern = qMessagePattern();
    if (!pattern) {
        // after destruction of static QMessagePattern instance
        message.append(str);
        return message;
    }

    bool skip = false;

    int timeArgsIdx = 0;
#ifdef QLOGGING_HAVE_BACKTRACE
    int backtraceArgsIdx = 0;
#endif

    // we do not convert file, function, line literals to local encoding due to overhead
    for (int i = 0; pattern->tokens[i]; ++i) {
        const char *token = pattern->tokens[i];
        if (token == endifTokenC) {
            skip = false;
        } else if (skip) {
            // we skip adding messages, but we have to iterate over
            // timeArgsIdx and backtraceArgsIdx anyway
            if (token == timeTokenC)
                timeArgsIdx++;
#ifdef QLOGGING_HAVE_BACKTRACE
            else if (token == backtraceTokenC)
                backtraceArgsIdx++;
#endif
        } else if (token == messageTokenC) {
            message.append(str);
        } else if (token == categoryTokenC) {
            message.append(QLatin1StringView(context.category));
        } else if (token == typeTokenC) {
            switch (type) {
            case QtDebugMsg:   message.append("debug"_L1); break;
            case QtInfoMsg:    message.append("info"_L1); break;
            case QtWarningMsg: message.append("warning"_L1); break;
            case QtCriticalMsg:message.append("critical"_L1); break;
            case QtFatalMsg:   message.append("fatal"_L1); break;
            }
        } else if (token == fileTokenC) {
            if (context.file)
                message.append(QLatin1StringView(context.file));
            else
                message.append("unknown"_L1);
        } else if (token == lineTokenC) {
            message.append(QString::number(context.line));
        } else if (token == functionTokenC) {
            if (context.function)
                message.append(QString::fromLatin1(qCleanupFuncinfo(context.function)));
            else
                message.append("unknown"_L1);
        } else if (token == pidTokenC) {
            message.append(QString::number(QCoreApplication::applicationPid()));
        } else if (token == appnameTokenC) {
            message.append(QCoreApplication::applicationName());
        } else if (token == threadidTokenC) {
            // print the TID as decimal
            message.append(QString::number(qt_gettid()));
        } else if (token == threadnameTokenC) {
            if (!qt_append_thread_name_to(message))
                message.append(QString::number(qt_gettid())); // fallback to the TID
        } else if (token == qthreadptrTokenC) {
            message.append("0x"_L1);
            message.append(QString::number(qlonglong(QThread::currentThread()->currentThread()), 16));
#ifdef QLOGGING_HAVE_BACKTRACE
        } else if (token == backtraceTokenC) {
            QMessagePattern::BacktraceParams backtraceParams = pattern->backtraceArgs.at(backtraceArgsIdx);
            backtraceArgsIdx++;
            message.append(formatBacktraceForLogMessage(backtraceParams, context));
#endif
        } else if (token == timeTokenC) {
            using namespace std::chrono;
            auto formatElapsedTime = [](steady_clock::duration time) {
                // we assume time > 0
                auto ms = duration_cast<milliseconds>(time);
                auto sec = duration_cast<seconds>(ms);
                ms -= sec;
                return QString::asprintf("%6lld.%03u", qint64(sec.count()), uint(ms.count()));
            };
            QString timeFormat = pattern->timeArgs.at(timeArgsIdx);
            timeArgsIdx++;
            if (timeFormat == "process"_L1) {
                message += formatElapsedTime(steady_clock::now() - pattern->appStartTime);
            } else if (timeFormat == "boot"_L1) {
                // just print the milliseconds since the elapsed timer reference
                // like the Linux kernel does
                message += formatElapsedTime(steady_clock::now().time_since_epoch());
#if QT_CONFIG(datestring)
            } else if (timeFormat.isEmpty()) {
                message.append(QDateTime::currentDateTime().toString(Qt::ISODate));
            } else {
                message.append(QDateTime::currentDateTime().toString(timeFormat));
#endif // QT_CONFIG(datestring)
            }
        } else if (token == ifCategoryTokenC) {
            if (isDefaultCategory(context.category))
                skip = true;
#define HANDLE_IF_TOKEN(LEVEL)  \
        } else if (token == if##LEVEL##TokenC) { \
            skip = type != Qt##LEVEL##Msg;
        HANDLE_IF_TOKEN(Debug)
        HANDLE_IF_TOKEN(Info)
        HANDLE_IF_TOKEN(Warning)
        HANDLE_IF_TOKEN(Critical)
        HANDLE_IF_TOKEN(Fatal)
#undef HANDLE_IF_TOKEN
        } else {
            message.append(QLatin1StringView(token));
        }
    }
    return message;
}